

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O2

optional<metaf::Distance> *
metaf::Distance::fromKmString(optional<metaf::Distance> *__return_storage_ptr__,string *s)

{
  size_type sVar1;
  bool bVar2;
  optional<unsigned_int> oVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_48;
  
  sVar1 = s->_M_string_length;
  if (sVar1 - 3 < 2) {
    std::__cxx11::string::substr((ulong)&bStack_48,(ulong)s);
    bVar2 = std::operator!=(&bStack_48,"KM");
    std::__cxx11::string::~string((string *)&bStack_48);
    if ((!bVar2) &&
       (oVar3 = strToUint(s,0,sVar1 - 2),
       ((ulong)oVar3.super__Optional_base<unsigned_int,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_int> >> 0x20 & 1) != 0)) {
      (__return_storage_ptr__->super__Optional_base<metaf::Distance,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::Distance>._M_payload._M_value.distModifier = NONE;
      (__return_storage_ptr__->super__Optional_base<metaf::Distance,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::Distance>._M_payload._M_value.dist.
      super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int> =
           (_Optional_payload_base<unsigned_int>)
           ((ulong)(oVar3.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                    super__Optional_payload_base<unsigned_int>._M_payload * 1000) | 0x100000000);
      (__return_storage_ptr__->super__Optional_base<metaf::Distance,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::Distance>._M_payload._M_value.distUnit = METERS;
      (__return_storage_ptr__->super__Optional_base<metaf::Distance,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::Distance>._M_engaged = true;
      return __return_storage_ptr__;
    }
  }
  *(undefined8 *)
   &(__return_storage_ptr__->super__Optional_base<metaf::Distance,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::Distance>._M_payload = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super__Optional_base<metaf::Distance,_true,_true>)._M_payload.
           super__Optional_payload_base<metaf::Distance>._M_payload._M_value.dist.
           super__Optional_base<unsigned_int,_true,_true>._M_payload + 4) = 0;
  *(undefined4 *)
   &(__return_storage_ptr__->super__Optional_base<metaf::Distance,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::Distance>._M_engaged = 0;
  return __return_storage_ptr__;
}

Assistant:

std::optional<Distance> Distance::fromKmString(const std::string & s) {
	//static const std::regex rgx ("(\\d\\d?)KM");
	static const std::optional<Distance> error;
	static const auto metersPerKm = 1000u;

	if (s.length() != 3 && s.length() != 4) return error;

	static const char kmStr[] = "KM"; 
	static const size_t kmStrLen = std::strlen(kmStr);
	const auto numLen = s.length() - kmStrLen;
	if (s.substr(numLen) != kmStr) return error;

	const auto dist = strToUint(s, 0, numLen);
	if (!dist.has_value()) return error;

	Distance distance;
	distance.distUnit = Unit::METERS;
	distance.dist = *dist * metersPerKm;
	return distance;
}